

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genmbcs.cpp
# Opt level: O0

UBool MBCSAddFromUnicode(MBCSData *mbcsData,uint8_t *bytes,int32_t length,UChar32 c,int8_t flag)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *puVar4;
  FILE *pFVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  uint *puVar10;
  bool bVar11;
  uint local_80;
  uint32_t maxOverlap;
  uint32_t overlap;
  uint32_t min;
  uint32_t newBlock;
  uint32_t nextOffset;
  uint32_t i;
  uint32_t newTop;
  uint32_t blockSize;
  int32_t maxCharLength;
  uint32_t stage3Index;
  uint32_t old;
  uint32_t b;
  uint32_t idx;
  uint8_t *p;
  uint8_t *stage3;
  uint8_t *pb;
  char buffer [10];
  int8_t flag_local;
  UChar32 c_local;
  int32_t length_local;
  uint8_t *bytes_local;
  MBCSData *mbcsData_local;
  
  pFVar5 = _stderr;
  uVar3 = (mbcsData->ucm->states).maxCharLength;
  buffer[2] = flag;
  buffer._3_4_ = c;
  unique0x10000580 = length;
  if ((((mbcsData->ucm->states).outputType == '\f') && (IGNORE_SISO_CHECK == '\0')) &&
     ((*bytes == '\x0e' || (*bytes == '\x0f')))) {
    pcVar9 = printBytes((char *)((long)&pb + 5),bytes,length);
    fprintf(pFVar5,"error: illegal mapping to SI or SO for SI/SO codepage: U+%04x<->0x%s\n",
            (ulong)(uint)c,pcVar9);
    mbcsData_local._7_1_ = '\0';
  }
  else if (((flag == '\x01') && (length == 1)) && (*bytes == '\0')) {
    fprintf(_stderr,"error: unable to encode a |1 fallback from U+%04x to 0x%02x\n",(ulong)(uint)c,
            (ulong)*bytes);
    mbcsData_local._7_1_ = '\0';
  }
  else {
    puVar4 = mbcsData->fromUBytes;
    uVar6 = c >> 10;
    if ((mbcsData->utf8Friendly == '\0') || ((int)(uint)mbcsData->utf8Max < c)) {
      min = c >> 4 & 0x3f;
    }
    else {
      min = c >> 4 & 0x3c;
    }
    if (mbcsData->stage1[uVar6] == 0) {
      overlap = mbcsData->stage2Top;
      if (mbcsData->utf8Friendly != '\0') {
        uVar7 = overlap - min;
        while( true ) {
          bVar11 = false;
          if (uVar7 < overlap) {
            bVar11 = mbcsData->stage2[overlap - 1] == 0;
          }
          if (!bVar11) break;
          overlap = overlap - 1;
        }
      }
      uVar7 = overlap + 0x40;
      newBlock = uVar6;
      if (0xfbc0 < uVar7) {
        pcVar9 = printBytes((char *)((long)&pb + 5),bytes,length);
        fprintf(pFVar5,"error: too many stage 2 entries at U+%04x<->0x%s\n",(ulong)(uint)c,pcVar9);
        return '\0';
      }
      for (; overlap < uVar7; overlap = overlap + 0x40) {
        mbcsData->stage1[newBlock] = (uint16_t)overlap;
        newBlock = newBlock + 1;
      }
      mbcsData->stage2Top = uVar7;
    }
    pFVar5 = _stderr;
    uVar6 = mbcsData->stage1[uVar6] + min;
    if ((mbcsData->utf8Friendly == '\0') || ((int)(uint)mbcsData->utf8Max < c)) {
      i = uVar3 << 4;
      min = c & 0xf;
    }
    else {
      i = uVar3 << 6;
      min = c & 0x3f;
    }
    if (mbcsData->stage2[uVar6] == 0) {
      overlap = mbcsData->stage3Top;
      if ((mbcsData->utf8Friendly != '\0') && (0xf < min)) {
        local_80 = 0;
        while( true ) {
          bVar11 = false;
          if (local_80 < (min & 0xfffffff0) * uVar3) {
            bVar11 = puVar4[(overlap - local_80) - 1] == '\0';
          }
          if (!bVar11) break;
          local_80 = local_80 + 1;
        }
        overlap = overlap - ((local_80 >> 4) / uVar3) * 0x10 * uVar3;
      }
      uVar7 = overlap + i;
      newBlock = uVar6;
      if (uVar3 << 0x14 < uVar7) {
        pcVar9 = printBytes((char *)((long)&pb + 5),bytes,length);
        fprintf(pFVar5,"error: too many code points at U+%04x<->0x%s\n",(ulong)(uint)c,pcVar9);
        return '\0';
      }
      for (; overlap < uVar7; overlap = uVar3 * 0x10 + overlap) {
        mbcsData->stage2[newBlock] = (overlap >> 4) / uVar3;
        newBlock = newBlock + 1;
      }
      mbcsData->stage3Top = uVar7;
    }
    uVar7 = (mbcsData->stage2[uVar6] & 0xffff) * 0x10;
    if ((mbcsData->utf8Friendly != '\0') && (c <= (int)(uint)mbcsData->utf8Max)) {
      if (uVar7 < 0x10000) {
        mbcsData->stageUTF8[c >> 6] = (uint16_t)uVar7;
      }
      else {
        mbcsData->utf8Max = 0xfeff;
      }
    }
    stage3Index = 0;
    stage3 = bytes;
    switch(length) {
    case 4:
      stage3 = bytes + 1;
      stage3Index = (uint32_t)*bytes;
    case 3:
      stage3Index = stage3Index << 8 | (uint)*stage3;
      stage3 = stage3 + 1;
    case 2:
      stage3Index = stage3Index << 8 | (uint)*stage3;
      stage3 = stage3 + 1;
    case 1:
    }
    bVar1 = *stage3;
    uVar8 = stage3Index << 8 | (uint)bVar1;
    maxCharLength = 0;
    puVar10 = (uint *)(puVar4 + (uVar7 + min) * uVar3);
    if (uVar3 == 2) {
      maxCharLength = (int32_t)(ushort)*puVar10;
      *(ushort *)puVar10 = (ushort)uVar8;
    }
    else if (uVar3 == 3) {
      uVar3 = *puVar10;
      *(byte *)puVar10 = (byte)(stage3Index >> 8);
      bVar2 = *(byte *)((long)puVar10 + 1);
      *(byte *)((long)puVar10 + 1) = (byte)stage3Index;
      maxCharLength =
           (uint)*(byte *)((long)puVar10 + 2) | (uint)bVar2 << 8 | (uint)(byte)uVar3 << 0x10;
      *(byte *)((long)puVar10 + 2) = bVar1;
    }
    else if (uVar3 == 4) {
      maxCharLength = *puVar10;
      *puVar10 = uVar8;
    }
    pFVar5 = _stderr;
    if ((((ulong)mbcsData->stage2[uVar6 + (min >> 4)] & 1L << ((byte)c & 0xf) + 0x10) != 0) ||
       (maxCharLength != 0)) {
      if (-1 < flag) {
        pcVar9 = printBytes((char *)((long)&pb + 5),bytes,length);
        fprintf(pFVar5,"error: duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
                (ulong)(uint)c,pcVar9,(ulong)(uint)maxCharLength);
        return '\0';
      }
      if (VERBOSE != '\0') {
        pcVar9 = printBytes((char *)((long)&pb + 5),bytes,length);
        fprintf(pFVar5,"duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",(ulong)(uint)c,
                pcVar9,(ulong)(uint)maxCharLength);
      }
    }
    if (buffer[2] < '\x01') {
      uVar6 = uVar6 + (min >> 4);
      mbcsData->stage2[uVar6] =
           mbcsData->stage2[uVar6] | (uint)(1L << ((byte)buffer._3_4_ & 0xf) + 0x10);
    }
    mbcsData_local._7_1_ = '\x01';
  }
  return mbcsData_local._7_1_;
}

Assistant:

static UBool
MBCSAddFromUnicode(MBCSData *mbcsData,
                   const uint8_t *bytes, int32_t length,
                   UChar32 c,
                   int8_t flag) {
    char buffer[10];
    const uint8_t *pb;
    uint8_t *stage3, *p;
    uint32_t idx, b, old, stage3Index;
    int32_t maxCharLength;

    uint32_t blockSize, newTop, i, nextOffset, newBlock, min, overlap, maxOverlap;

    maxCharLength=mbcsData->ucm->states.maxCharLength;

    if( mbcsData->ucm->states.outputType==MBCS_OUTPUT_2_SISO &&
        (!IGNORE_SISO_CHECK && (*bytes==0xe || *bytes==0xf))
    ) {
        fprintf(stderr, "error: illegal mapping to SI or SO for SI/SO codepage: U+%04x<->0x%s\n",
            (int)c, printBytes(buffer, bytes, length));
        return FALSE;
    }

    if(flag==1 && length==1 && *bytes==0) {
        fprintf(stderr, "error: unable to encode a |1 fallback from U+%04x to 0x%02x\n",
            (int)c, *bytes);
        return FALSE;
    }

    /*
     * Walk down the triple-stage compact array ("trie") and
     * allocate parts as necessary.
     * Note that the first stage 2 and 3 blocks are reserved for
     * all-unassigned mappings.
     * We assume that length<=maxCharLength and that c<=0x10ffff.
     */
    stage3=mbcsData->fromUBytes;

    /* inspect stage 1 */
    idx=c>>MBCS_STAGE_1_SHIFT;
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        nextOffset=(c>>MBCS_STAGE_2_SHIFT)&MBCS_STAGE_2_BLOCK_MASK&~(MBCS_UTF8_STAGE_3_BLOCKS-1);
    } else {
        nextOffset=(c>>MBCS_STAGE_2_SHIFT)&MBCS_STAGE_2_BLOCK_MASK;
    }
    if(mbcsData->stage1[idx]==MBCS_STAGE_2_ALL_UNASSIGNED_INDEX) {
        /* allocate another block in stage 2 */
        newBlock=mbcsData->stage2Top;
        if(mbcsData->utf8Friendly) {
            min=newBlock-nextOffset; /* minimum block start with overlap */
            while(min<newBlock && mbcsData->stage2[newBlock-1]==0) {
                --newBlock;
            }
        }
        newTop=newBlock+MBCS_STAGE_2_BLOCK_SIZE;

        if(newTop>MBCS_MAX_STAGE_2_TOP) {
            fprintf(stderr, "error: too many stage 2 entries at U+%04x<->0x%s\n",
                (int)c, printBytes(buffer, bytes, length));
            return FALSE;
        }

        /*
         * each stage 2 block contains 64 32-bit words:
         * 6 code point bits 9..4 with value with bits 31..16 "assigned" flags and bits 15..0 stage 3 index
         */
        i=idx;
        while(newBlock<newTop) {
            mbcsData->stage1[i++]=(uint16_t)newBlock;
            newBlock+=MBCS_STAGE_2_BLOCK_SIZE;
        }
        mbcsData->stage2Top=newTop; /* ==newBlock */
    }

    /* inspect stage 2 */
    idx=mbcsData->stage1[idx]+nextOffset;
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        /* allocate 64-entry blocks for UTF-8-friendly lookup */
        blockSize=MBCS_UTF8_STAGE_3_BLOCK_SIZE*maxCharLength;
        nextOffset=c&MBCS_UTF8_STAGE_3_BLOCK_MASK;
    } else {
        blockSize=MBCS_STAGE_3_BLOCK_SIZE*maxCharLength;
        nextOffset=c&MBCS_STAGE_3_BLOCK_MASK;
    }
    if(mbcsData->stage2[idx]==0) {
        /* allocate another block in stage 3 */
        newBlock=mbcsData->stage3Top;
        if(mbcsData->utf8Friendly && nextOffset>=MBCS_STAGE_3_GRANULARITY) {
            /*
             * Overlap stage 3 blocks only in multiples of 16-entry blocks
             * because of the indexing granularity in stage 2.
             */
            maxOverlap=(nextOffset&~(MBCS_STAGE_3_GRANULARITY-1))*maxCharLength;
            for(overlap=0;
                overlap<maxOverlap && stage3[newBlock-overlap-1]==0;
                ++overlap) {}

            overlap=(overlap/MBCS_STAGE_3_GRANULARITY)/maxCharLength;
            overlap=(overlap*MBCS_STAGE_3_GRANULARITY)*maxCharLength;

            newBlock-=overlap;
        }
        newTop=newBlock+blockSize;

        if(newTop>MBCS_STAGE_3_MBCS_SIZE*(uint32_t)maxCharLength) {
            fprintf(stderr, "error: too many code points at U+%04x<->0x%s\n",
                (int)c, printBytes(buffer, bytes, length));
            return FALSE;
        }
        /* each block has 16*maxCharLength bytes */
        i=idx;
        while(newBlock<newTop) {
            mbcsData->stage2[i++]=(newBlock/MBCS_STAGE_3_GRANULARITY)/maxCharLength;
            newBlock+=MBCS_STAGE_3_BLOCK_SIZE*maxCharLength;
        }
        mbcsData->stage3Top=newTop; /* ==newBlock */
    }

    stage3Index=MBCS_STAGE_3_GRANULARITY*(uint32_t)(uint16_t)mbcsData->stage2[idx];

    /* Build an alternate, UTF-8-friendly stage table as well. */
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        /* Overflow for uint16_t entries in stageUTF8? */
        if(stage3Index>0xffff) {
            /*
             * This can occur only if the mapping table is nearly perfectly filled and if
             * utf8Max==0xffff.
             * (There is no known charset like this. GB 18030 does not map
             * surrogate code points and LMBCS does not map 256 PUA code points.)
             *
             * Otherwise, stage3Index<=MBCS_UTF8_LIMIT<0xffff
             * (stage3Index can at most reach exactly MBCS_UTF8_LIMIT)
             * because we have a sorted table and there are at most MBCS_UTF8_LIMIT
             * mappings with 0<=c<MBCS_UTF8_LIMIT, and there is only also
             * the initial all-unassigned block in stage3.
             *
             * Solution for the overflow: Reduce utf8Max to the next lower value, 0xfeff.
             *
             * (See svn revision 20866 of the markus/ucnvutf8 feature branch for
             * code that causes MBCSAddTable() to rebuild the table not utf8Friendly
             * in case of overflow. That code was not tested.)
             */
            mbcsData->utf8Max=0xfeff;
        } else {
            /*
             * The stage 3 block has been assigned for the regular trie.
             * Just copy its index into stageUTF8[], without the granularity.
             */
            mbcsData->stageUTF8[c>>MBCS_UTF8_STAGE_SHIFT]=(uint16_t)stage3Index;
        }
    }

    /* write the codepage bytes into stage 3 and get the previous bytes */

    /* assemble the bytes into a single integer */
    pb=bytes;
    b=0;
    switch(length) {
    case 4:
        b=*pb++;
        U_FALLTHROUGH;
    case 3:
        b=(b<<8)|*pb++;
        U_FALLTHROUGH;
    case 2:
        b=(b<<8)|*pb++;
        U_FALLTHROUGH;
    case 1:
    default:
        b=(b<<8)|*pb++;
        break;
    }

    old=0;
    p=stage3+(stage3Index+nextOffset)*maxCharLength;
    switch(maxCharLength) {
    case 2:
        old=*(uint16_t *)p;
        *(uint16_t *)p=(uint16_t)b;
        break;
    case 3:
        old=(uint32_t)*p<<16;
        *p++=(uint8_t)(b>>16);
        old|=(uint32_t)*p<<8;
        *p++=(uint8_t)(b>>8);
        old|=*p;
        *p=(uint8_t)b;
        break;
    case 4:
        old=*(uint32_t *)p;
        *(uint32_t *)p=b;
        break;
    default:
        /* will never occur */
        break;
    }

    /* check that this Unicode code point was still unassigned */
    if((mbcsData->stage2[idx+(nextOffset>>MBCS_STAGE_2_SHIFT)]&(1UL<<(16+(c&0xf))))!=0 || old!=0) {
        if(flag>=0) {
            fprintf(stderr, "error: duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
                (int)c, printBytes(buffer, bytes, length), (int)old);
            return FALSE;
        } else if(VERBOSE) {
            fprintf(stderr, "duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
                (int)c, printBytes(buffer, bytes, length), (int)old);
        }
        /* continue after the above warning if the precision of the mapping is
           unspecified */
    }
    if(flag<=0) {
        /* set the roundtrip flag */
        mbcsData->stage2[idx+(nextOffset>>4)]|=(1UL<<(16+(c&0xf)));
    }

    return TRUE;
}